

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O0

void * dowait(void *data)

{
  __pid_t _Var1;
  long lVar2;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  ssize_t r_1;
  process_info_t *p;
  int r;
  int i;
  dowait_args *args;
  void *data_local;
  
  p._4_4_ = 0;
  do {
    if (*(int *)((long)data + 0x10) <= p._4_4_) {
      if (-1 < *(int *)((long)data + 4)) {
        do {
          sVar3 = write(*(int *)((long)data + 4),"",1);
          bVar5 = false;
          if (sVar3 == -1) {
            piVar4 = __errno_location();
            bVar5 = *piVar4 == 4;
          }
        } while (bVar5);
      }
      return (void *)0x0;
    }
    lVar2 = *(long *)((long)data + 8) + (long)p._4_4_ * 0x400;
    if (*(int *)(lVar2 + 0x1c) == 0) {
      _Var1 = waitpid(*(__pid_t *)(lVar2 + 8),(int *)(lVar2 + 0x18),0);
      if (_Var1 < 0) {
        perror("waitpid");
        return (void *)0x0;
      }
      *(undefined4 *)(lVar2 + 0x1c) = 1;
    }
    p._4_4_ = p._4_4_ + 1;
  } while( true );
}

Assistant:

static void* dowait(void* data) {
  dowait_args* args = data;

  int i, r;
  process_info_t* p;

  for (i = 0; i < args->n; i++) {
    p = (process_info_t*)(args->vec + i * sizeof(process_info_t));
    if (p->terminated) continue;
    r = waitpid(p->pid, &p->status, 0);
    if (r < 0) {
      perror("waitpid");
      return NULL;
    }
    p->terminated = 1;
  }

  if (args->pipe[1] >= 0) {
    /* Write a character to the main thread to notify it about this. */
    ssize_t r;

    do
      r = write(args->pipe[1], "", 1);
    while (r == -1 && errno == EINTR);
  }

  return NULL;
}